

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O2

void __thiscall
miniros::MessageEvent<const_void>::operator=
          (MessageEvent<const_void> *this,MessageEvent<const_void> *rhs)

{
  ConstMessagePtr msg;
  EVP_PKEY_CTX local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  MessageEvent<void_const> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  MessageEvent<void_const>::copyMessageIfNecessary<void_const>(local_30);
  std::static_pointer_cast<void_const,void_const>((shared_ptr<const_void> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  init(this,local_40);
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->message_copy_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void operator=(const MessageEvent<ConstMessage>& rhs)
  {
    ConstMessagePtr msg = std::static_pointer_cast<ConstMessage>(rhs.getMessage());
    init(msg,
      rhs.getConnectionHeaderPtr(),
      rhs.getReceiptTime(), rhs.nonConstWillCopy(), rhs.getMessageFactory());
    message_copy_.reset();
  }